

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu_bar.cpp
# Opt level: O2

bool menu_bar_sub_item_active_2_proc(Am_Object *self)

{
  bool bVar1;
  bool bVar2;
  Am_Value *pAVar3;
  Am_Object main_item;
  Am_Object win;
  Am_Object owner;
  
  Am_Object::Get_Owner(&owner,(Am_Slot_Flags)self);
  bVar1 = Am_Object::Valid(&owner);
  if (bVar1) {
    pAVar3 = Am_Object::Get(&owner,0x17d,0);
    bVar1 = Am_Value::operator_cast_to_bool(pAVar3);
    if (!bVar1) {
      bVar1 = false;
      goto LAB_0026a5a4;
    }
  }
  pAVar3 = Am_Object::Get(self,0x68,0);
  Am_Object::Am_Object(&win,pAVar3);
  bVar2 = Am_Object::Valid(&win);
  bVar1 = true;
  if (bVar2) {
    pAVar3 = Am_Object::Get(&win,0x1d3,0);
    Am_Object::Am_Object(&main_item,pAVar3);
    bVar2 = Am_Object::Valid(&main_item);
    if (bVar2) {
      pAVar3 = Am_Object::Get(&main_item,0x17d,0);
      bVar2 = Am_Value::operator_cast_to_bool(pAVar3);
      if (!bVar2) {
        Am_Object::~Am_Object(&main_item);
        bVar1 = false;
        goto LAB_0026a59a;
      }
    }
    Am_Object::~Am_Object(&main_item);
  }
LAB_0026a59a:
  Am_Object::~Am_Object(&win);
LAB_0026a5a4:
  Am_Object::~Am_Object(&owner);
  return bVar1;
}

Assistant:

Am_Define_Formula(bool, menu_bar_sub_item_active_2)
{
  Am_Object owner = self.Get_Owner();
  if (owner.Valid() && !(bool)owner.Get(Am_ACTIVE_2))
    return false;
  // now check the main-item I am attached to, if any
  Am_Object win = self.Get(Am_WINDOW);
  if (win.Valid()) {
    Am_Object main_item = win.Get(Am_FOR_ITEM);
    if (main_item.Valid() && !(bool)main_item.Get(Am_ACTIVE_2))
      return false;
  }
  return true;
}